

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

Node __thiscall xt::vector::pushTail(vector *this,Vector *v,uint level,Node *parent,Node *tailnode)

{
  element_type *peVar1;
  TypeInfo *pTVar2;
  _Node *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Object *this_01;
  long lVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Object *o;
  uint uVar6;
  Node NVar7;
  Node nodeToInsert;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_e0 [2];
  Node *local_d0;
  Object local_c8;
  Node local_a0;
  Node local_90;
  Node local_80;
  Vector local_70;
  vector *local_60;
  Vector *local_58;
  Object local_50;
  
  uVar6 = ((v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->cnt;
  local_d0 = tailnode;
  local_58 = v;
  this_00 = (_Node *)operator_new(0x10);
  _Node::_Node(this_00);
  *(_Node **)this = this_00;
  local_60 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<xt::_Node*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_60,this_00);
  peVar1 = (((parent->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->array).
           super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  o = *(Object **)&(peVar1->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)._M_impl;
  lVar4 = (long)*(pointer *)
                 ((long)&(peVar1->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>).
                         _M_impl + 8) - (long)o >> 5;
  if (0 < lVar4) {
    this_01 = *(Object **)**(undefined8 **)this;
    lVar4 = lVar4 + 1;
    do {
      Object::operator=(this_01,o);
      o = o + 1;
      this_01 = this_01 + 1;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  uVar6 = uVar6 - 1 >> ((byte)level & 0x1f) & 0x1f;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (level == 5) {
    local_e8 = (local_d0->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (a_Stack_e0,
               &(local_d0->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  }
  else {
    Object::Object(&local_50,
                   (Object *)
                   ((ulong)(uVar6 << 5) +
                   *(long *)&(((((parent->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->array).
                               super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)
                             ._M_impl));
    if (local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 8) =
             *(_Atomic_word *)
              ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 8) =
             *(_Atomic_word *)
              ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 8) + 1;
      }
    }
    if (local_50.field_2.raw == (void *)0x0) {
      local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (local_d0->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (local_d0->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      newPath((vector *)&local_c8,level - 5,&local_a0);
    }
    else {
      local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (local_58->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (local_58->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
      ;
      if (local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_80.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_50.field_2.number;
      local_80.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)
           ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 8) =
               *(_Atomic_word *)
                ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)
           ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 8) =
               *(_Atomic_word *)
                ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 8) + 1;
        }
      }
      local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (local_d0->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (local_d0->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pushTail((vector *)&local_c8,&local_70,level - 5,&local_80,&local_90);
    }
    pTVar2 = local_c8.typeinfo;
    local_e8 = (element_type *)local_c8._0_8_;
    _Var5._M_pi = a_Stack_e0[0]._M_pi;
    local_c8._0_8_ = (element_type *)0x0;
    local_c8.typeinfo = (TypeInfo *)0x0;
    a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTVar2;
    if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.typeinfo !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.typeinfo);
    }
    _Var5._M_pi = local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    if (local_50.field_2.raw != (void *)0x0) {
      if (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      _Var5._M_pi = local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi;
      if (local_80.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
        _Var5._M_pi = local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
    }
    if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
    }
    if (local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  _Var5._M_pi = a_Stack_e0[0]._M_pi;
  if (a_Stack_e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (a_Stack_e0[0]._M_pi)->_M_use_count = (a_Stack_e0[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (a_Stack_e0[0]._M_pi)->_M_use_count = (a_Stack_e0[0]._M_pi)->_M_use_count + 1;
    }
    if (a_Stack_e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (a_Stack_e0[0]._M_pi)->_M_use_count = (a_Stack_e0[0]._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (a_Stack_e0[0]._M_pi)->_M_use_count = (a_Stack_e0[0]._M_pi)->_M_use_count + 1;
      }
    }
  }
  local_c8.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)a_Stack_e0[0]._M_pi;
  local_c8.field_2.number = (double)local_e8;
  local_c8.typeinfo = (TypeInfo *)_Node::type_info;
  local_c8.type = Pointer;
  Object::operator=((Object *)((ulong)(uVar6 << 5) + *(long *)**(undefined8 **)this),&local_c8);
  _Var3._M_pi = extraout_RDX;
  if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (a_Stack_e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_e0[0]._M_pi);
    _Var3._M_pi = extraout_RDX_01;
  }
  NVar7.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  NVar7.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Node)NVar7.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node pushTail(Vector v, unsigned int level, Node parent, Node tailnode) {
	unsigned int subidx = ((v->cnt -1) >> level) & 0x01f;
	Node ret = Node(new _Node);
	std::copy(parent->array->begin(), parent->array->end(), ret->array->begin());
	Node nodeToInsert;
	if (level == 5)
		nodeToInsert = tailnode;
	else {
		Node child = to_node((*parent->array)[subidx]);
		nodeToInsert = (child != nullptr) ? pushTail(v, level - 5, child, tailnode) : newPath(level - 5, tailnode);
	}
	(*ret->array)[subidx] = nodeToInsert;
	return ret;
}